

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_cfile_stream.h
# Opt level: O0

ssize_t __thiscall crnlib::cfile_stream::write(cfile_stream *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  size_t sVar2;
  unsigned_long_long uVar3;
  undefined4 in_register_00000034;
  uint len_local;
  void *pBuf_local;
  cfile_stream *this_local;
  
  this_local._4_4_ = (uint)__buf;
  if (((((this->super_data_stream).field_0x1a & 1) == 0) ||
      (bVar1 = data_stream::is_writable(&this->super_data_stream), !bVar1)) ||
     (this_local._4_4_ == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    sVar2 = fwrite((void *)CONCAT44(in_register_00000034,__fd),1,(ulong)__buf & 0xffffffff,
                   (FILE *)this->m_pFile);
    if (sVar2 == ((ulong)__buf & 0xffffffff)) {
      this->m_ofs = ((ulong)__buf & 0xffffffff) + this->m_ofs;
      uVar3 = math::maximum<unsigned_long_long>(this->m_size,this->m_ofs);
      this->m_size = uVar3;
    }
    else {
      data_stream::set_error(&this->super_data_stream);
      this_local._4_4_ = 0;
    }
  }
  return (ulong)this_local._4_4_;
}

Assistant:

virtual uint write(const void* pBuf, uint len)
        {
            CRNLIB_ASSERT(pBuf && (len <= 0x7FFFFFFF));

            if (!m_opened || (!is_writable()) || (!len))
            {
                return 0;
            }

            if (fwrite(pBuf, 1, len, m_pFile) != len)
            {
                set_error();
                return 0;
            }

            m_ofs += len;
            m_size = math::maximum(m_size, m_ofs);

            return len;
        }